

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  void *this;
  mapped_type *pmVar4;
  long in_RSI;
  bool res;
  int i_1;
  map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  counter;
  int warmup;
  longlong i;
  CircuitOramOpt oram;
  longlong N;
  int evict;
  int access;
  int cap;
  int logN;
  size_t *in_stack_ffffffffffffe828;
  char *pcVar5;
  TreeOram *in_stack_ffffffffffffe830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe838;
  CircuitOramOpt *in_stack_ffffffffffffe840;
  allocator *paVar6;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe868;
  allocator *in_stack_ffffffffffffe870;
  long local_1758;
  allocator<char> local_16c9;
  string local_16c8 [39];
  allocator local_16a1;
  string local_16a0 [39];
  allocator local_1679;
  string local_1678 [39];
  allocator local_1651;
  string local_1650 [39];
  allocator local_1629;
  string local_1628 [32];
  string local_1608 [32];
  string local_15e8 [32];
  string local_15c8 [32];
  string local_15a8 [32];
  string local_1588 [32];
  string local_1568 [32];
  string local_1548 [32];
  string local_1528 [32];
  long local_1508;
  uint in_stack_ffffffffffffeb00;
  map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  *in_stack_ffffffffffffeb08;
  longlong in_stack_ffffffffffffeb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_14c0;
  CircuitOramOpt local_14b8;
  long local_d0;
  allocator local_c1;
  string local_c0 [32];
  int local_a0;
  allocator local_99;
  string local_98 [32];
  int local_78;
  allocator local_71;
  string local_70 [32];
  int local_50;
  allocator local_39;
  string local_38 [36];
  int local_14;
  long local_10;
  undefined4 local_4;
  
  local_4 = 0;
  pcVar5 = *(char **)(in_RSI + 8);
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar5,&local_39);
  iVar1 = std::__cxx11::stoi((string *)in_stack_ffffffffffffe830,in_stack_ffffffffffffe828,0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar5 = *(char **)(local_10 + 0x10);
  local_14 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar5,&local_71);
  iVar1 = std::__cxx11::stoi((string *)in_stack_ffffffffffffe830,in_stack_ffffffffffffe828,0);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pcVar5 = *(char **)(local_10 + 0x18);
  local_50 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,pcVar5,&local_99);
  iVar1 = std::__cxx11::stoi((string *)in_stack_ffffffffffffe830,in_stack_ffffffffffffe828,0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  pcVar5 = *(char **)(local_10 + 0x20);
  local_78 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,pcVar5,&local_c1);
  iVar1 = std::__cxx11::stoi((string *)in_stack_ffffffffffffe830,in_stack_ffffffffffffe828,0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  local_d0 = (long)(1 << ((byte)local_14 & 0x1f));
  local_a0 = iVar1;
  CircuitOramOpt::CircuitOramOpt
            (in_stack_ffffffffffffe840,(int)((ulong)in_stack_ffffffffffffe838 >> 0x20),
             (int)in_stack_ffffffffffffe838,(int)((ulong)in_stack_ffffffffffffe830 >> 0x20),
             (int)in_stack_ffffffffffffe830);
  std::
  map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  ::map((map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
         *)0x108b93);
  poVar3 = std::operator<<((ostream *)&std::cout,"Starting warmming up with ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x100000);
  poVar3 = std::operator<<(poVar3," operations.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  iVar1 = 0;
  while( true ) {
    if (local_d0 < 0x100001) {
      local_1758 = 0x100000;
    }
    else {
      local_1758 = local_d0;
    }
    if (local_1758 <= iVar1) break;
    CircuitOramOpt::access
              (&local_14b8,(char *)((long)iVar1 % local_d0 & 0xffffffff),
               (int)((long)iVar1 % local_d0));
    iVar1 = iVar1 + 1;
  }
  local_14c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  poVar3 = std::operator<<((ostream *)&std::cout,"Warmup completed.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  do {
    iVar2 = CircuitOramOpt::access
                      (&local_14b8,(char *)((long)local_14c0 % local_d0 & 0xffffffff),
                       (int)((long)local_14c0 % local_d0));
    in_stack_ffffffffffffeb00 = CONCAT13((char)iVar2,(int3)in_stack_ffffffffffffeb00) & 0x1ffffff;
    if ((char)(in_stack_ffffffffffffeb00 >> 0x18) == '\0') {
      poVar3 = std::operator<<((ostream *)&std::cout,"tree oram invariance is broken");
      this = (void *)std::ostream::operator<<(poVar3,(longlong)local_14c0);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    iVar2 = TreeOram::stash_size(in_stack_ffffffffffffe830);
    local_1508 = (long)iVar2;
    pmVar4 = std::
             map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
             ::operator[]((map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
                           *)in_stack_ffffffffffffe870,(key_type *)in_stack_ffffffffffffe868);
    *pmVar4 = *pmVar4 + 1;
    local_14c0 = local_14c0 + 1;
    if ((long)local_14c0 % 1000000 == 0) {
      in_stack_ffffffffffffe870 = &local_1629;
      in_stack_ffffffffffffe868 = local_14c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1628,"circuit_opt",in_stack_ffffffffffffe870);
      std::operator+(in_stack_ffffffffffffe838,(char *)in_stack_ffffffffffffe830);
      pcVar5 = *(char **)(local_10 + 8);
      __rhs = &local_1651;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1650,pcVar5,__rhs);
      std::operator+(in_stack_ffffffffffffe868,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(in_stack_ffffffffffffe838,(char *)in_stack_ffffffffffffe830);
      pcVar5 = *(char **)(local_10 + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1678,pcVar5,&local_1679);
      std::operator+(in_stack_ffffffffffffe868,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(in_stack_ffffffffffffe838,(char *)in_stack_ffffffffffffe830);
      in_stack_ffffffffffffe838 =
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_10 + 0x18);
      paVar6 = &local_16a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_16a0,(char *)in_stack_ffffffffffffe838,paVar6);
      std::operator+(in_stack_ffffffffffffe868,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(in_stack_ffffffffffffe838,(char *)in_stack_ffffffffffffe830);
      pcVar5 = *(char **)(local_10 + 0x20);
      in_stack_ffffffffffffe830 = (TreeOram *)&local_16c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_16c8,pcVar5,(allocator *)in_stack_ffffffffffffe830);
      std::operator+(in_stack_ffffffffffffe868,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      pruint64_t(in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,
                 (string *)CONCAT44(iVar1,in_stack_ffffffffffffeb00));
      std::__cxx11::string::~string(local_1528);
      std::__cxx11::string::~string(local_16c8);
      std::allocator<char>::~allocator(&local_16c9);
      std::__cxx11::string::~string(local_1548);
      std::__cxx11::string::~string(local_1568);
      std::__cxx11::string::~string(local_16a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_16a1);
      std::__cxx11::string::~string(local_1588);
      std::__cxx11::string::~string(local_15a8);
      std::__cxx11::string::~string(local_1678);
      std::allocator<char>::~allocator((allocator<char> *)&local_1679);
      std::__cxx11::string::~string(local_15c8);
      std::__cxx11::string::~string(local_15e8);
      std::__cxx11::string::~string(local_1650);
      std::allocator<char>::~allocator((allocator<char> *)&local_1651);
      std::__cxx11::string::~string(local_1608);
      std::__cxx11::string::~string(local_1628);
      std::allocator<char>::~allocator((allocator<char> *)&local_1629);
    }
  } while( true );
}

Assistant:

int main(int argc, char ** argv )
{
   int logN = stoi(string(argv[1]));
   int cap = stoi(string(argv[2]));
   int access = stoi(string(argv[3]));
   int evict = stoi(string(argv[4]));
      
   long long N = (1<<logN);
   CircuitOramOpt oram(logN, cap, access, evict);
   long long i = 0;
   int warmup = 1<<20;
   map<long long, long long> counter;
   
   cout <<"Starting warmming up with "<<warmup<<" operations."<<endl;
   for(int i = 0; i < (N > warmup ? N : warmup); ++i)
      oram.access(i%N);
   i = 0;
   cout <<"Warmup completed."<<endl;
   while(true)
   {
      bool res = oram.access(i%N);
      if(not res)
      {
         cout<<"tree oram invariance is broken"<<i<<endl;
      }
      ++counter[oram.stash_size()];
      ++i;
      if((i%1000000) == 0)
         pruint64_t(i, counter, string("circuit_opt")+"_"+string(argv[1])+"_"+string(argv[2])+"_"+string(argv[3])+"_"+string(argv[4]));
   }
}